

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_alpn_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_98 [8];
  CBB proto_list;
  CBB contents;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar1 = Array<unsigned_char>::empty(&hs->config->alpn_client_proto_list);
  if ((bVar1) && (iVar2 = SSL_is_quic(ssl_00), iVar2 != 0)) {
    ERR_put_error(0x10,0,0x133,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x545);
    hs_local._7_1_ = false;
  }
  else {
    bVar1 = Array<unsigned_char>::empty(&hs->config->alpn_client_proto_list);
    if ((bVar1) || ((*(ushort *)&ssl_00->s3->field_0xdc >> 4 & 1) != 0)) {
      hs_local._7_1_ = true;
    }
    else {
      iVar2 = CBB_add_u16(out_compressible,0x10);
      if (((iVar2 != 0) &&
          (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&proto_list.u + 0x18))
          , iVar2 != 0)) &&
         (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&proto_list.u + 0x18),(CBB *)local_98),
         iVar2 != 0)) {
        data = Array<unsigned_char>::data(&hs->config->alpn_client_proto_list);
        len = Array<unsigned_char>::size(&hs->config->alpn_client_proto_list);
        iVar2 = CBB_add_bytes((CBB *)local_98,data,len);
        if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
          return true;
        }
      }
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_alpn_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (hs->config->alpn_client_proto_list.empty() && SSL_is_quic(ssl)) {
    // ALPN MUST be used with QUIC.
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_APPLICATION_PROTOCOL);
    return false;
  }

  if (hs->config->alpn_client_proto_list.empty() ||
      ssl->s3->initial_handshake_complete) {
    return true;
  }

  CBB contents, proto_list;
  if (!CBB_add_u16(out_compressible,
                   TLSEXT_TYPE_application_layer_protocol_negotiation) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list) ||
      !CBB_add_bytes(&proto_list, hs->config->alpn_client_proto_list.data(),
                     hs->config->alpn_client_proto_list.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}